

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half_perf_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__nptr;
  int iVar1;
  int iVar2;
  
  iVar1 = 0x5eec00;
  iVar2 = 0;
  if (1 < argc) {
    __nptr = argv[1];
    iVar1 = atoi(__nptr);
    iVar2 = 0;
    if (iVar1 < 1) {
      fprintf(_stderr,"Bad entry count \'%s\'\n",__nptr);
      iVar2 = 1;
    }
  }
  if (0 < iVar1) {
    main_cold_1();
  }
  return iVar2;
}

Assistant:

int
main (int argc, char* argv[])
{
    int ret        = 0;
    int numentries = 1920 * 1080 * 3;
    if (argc > 1)
    {
        numentries = atoi (argv[1]);

        if (numentries <= 0)
        {
            fprintf (stderr, "Bad entry count '%s'\n", argv[1]);
            ret = 1;
        }
    }

    if (numentries > 0)
    {
        uint16_t* halfs  = new uint16_t[numentries];
        float*    floats = new float[numentries];

        if (halfs && floats)
        {
            Rand48 r(numentries);
            for (int i = 0; i < numentries; ++i)
            {
                halfs[i]  = (uint16_t) r.nexti();
                floats[i] = imath_half_to_float (halfs[i]);
            }
            perf_test_half_to_float (floats, halfs, numentries);

            // test float -> half with real-world values
            for (int i = 0; i < numentries; ++i)
                floats[i] = float(r.nextf(-65504, 65504));
            perf_test_float_to_half (halfs, floats, numentries);
        }

        delete[] halfs;
        delete[] floats;
    }

    return ret;
}